

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowLeadLagLocalState::Sink
          (WindowLeadLagLocalState *this,WindowExecutorGlobalState *gstate,DataChunk *sink_chunk,
          DataChunk *coll_chunk,idx_t input_idx)

{
  WindowMergeSortTreeLocalState *this_00;
  
  WindowValueLocalState::Sink
            (&this->super_WindowValueLocalState,gstate,sink_chunk,coll_chunk,input_idx);
  if ((this->local_row).
      super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
      .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl !=
      (WindowAggregatorState *)0x0) {
    this_00 = (WindowMergeSortTreeLocalState *)
              unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
              ::operator->(&this->local_row);
    WindowMergeSortTreeLocalState::SinkChunk
              (this_00,sink_chunk,input_idx,(optional_ptr<duckdb::SelectionVector,_true>)0x0,0);
    return;
  }
  return;
}

Assistant:

void WindowLeadLagLocalState::Sink(WindowExecutorGlobalState &gstate, DataChunk &sink_chunk, DataChunk &coll_chunk,
                                   idx_t input_idx) {
	WindowValueLocalState::Sink(gstate, sink_chunk, coll_chunk, input_idx);

	if (local_row) {
		idx_t filtered = 0;
		optional_ptr<SelectionVector> filter_sel;

		auto &row_state = local_row->Cast<WindowMergeSortTreeLocalState>();
		row_state.SinkChunk(sink_chunk, input_idx, filter_sel, filtered);
	}
}